

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O3

void __thiscall QFileDialogPrivate::emitUrlsSelected(QFileDialogPrivate *this,QList<QUrl> *files)

{
  QObject *pQVar1;
  char cVar2;
  long lVar3;
  QUrl *file;
  long in_FS_OFFSET;
  QString local_68;
  QArrayDataPointer<QString> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  local_48.d = (Data *)0x0;
  local_48.ptr = (QString *)files;
  QMetaObject::activate(pQVar1,&QFileDialog::staticMetaObject,5,&local_48.d);
  local_48.size = 0;
  local_48.d = (Data *)0x0;
  local_48.ptr = (QString *)0x0;
  lVar3 = (files->d).size;
  if (lVar3 != 0) {
    lVar3 = lVar3 << 3;
    do {
      cVar2 = QUrl::isLocalFile();
      if (cVar2 != '\0') {
        QUrl::toLocalFile();
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&local_48,local_48.size,&local_68);
        QList<QString>::end((QList<QString> *)&local_48);
        if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      lVar3 = lVar3 + -8;
    } while (lVar3 != 0);
    if (local_48.size != 0) {
      local_68.d.d = (Data *)0x0;
      local_68.d.ptr = (char16_t *)&local_48;
      QMetaObject::activate(pQVar1,&QFileDialog::staticMetaObject,1,(void **)&local_68);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::emitUrlsSelected(const QList<QUrl> &files)
{
    Q_Q(QFileDialog);
    emit q->urlsSelected(files);
    QStringList localFiles;
    for (const QUrl &file : files)
        if (file.isLocalFile())
            localFiles.append(file.toLocalFile());
    if (!localFiles.isEmpty())
        emit q->filesSelected(localFiles);
}